

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

Payload * __thiscall
anon_unknown.dwarf_1be885c::Impl::processEvent
          (Payload *__return_storage_ptr__,Impl *this,Deserializer *d)

{
  bool bVar1;
  undefined8 uVar2;
  ulong uVar3;
  anon_class_48_3_1cb1d0c0 local_178;
  anon_class_24_3_37c11afe local_148;
  function<bool_(dap::Deserializer_*)> local_130;
  allocator<char> local_109;
  string local_108 [39];
  bool local_e1;
  uint8_t *puStack_e0;
  bool body_ok;
  uint8_t *data;
  pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_> local_c8;
  undefined1 local_a0 [8];
  GenericEventHandler handler;
  TypeInfo *typeinfo;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string event;
  Deserializer *d_local;
  Impl *this_local;
  
  event.field_2._8_8_ = d;
  std::__cxx11::string::string((string *)local_40);
  uVar2 = event.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"event",&local_61);
  bVar1 = dap::json::JsonCppDeserializer::field<std::__cxx11::string>
                    ((JsonCppDeserializer *)uVar2,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::function<void_(const_void_*)>::function((function<void_(const_void_*)> *)local_a0);
    EventHandlers::event(&local_c8,&this->handlers,(string *)local_40);
    std::tie<dap::TypeInfo_const*,std::function<void(void_const*)>>
              ((TypeInfo **)&data,(function<void_(const_void_*)> *)&handler._M_invoker);
    std::tuple<dap::TypeInfo_const*&,std::function<void(void_const*)>&>::operator=
              ((tuple<dap::TypeInfo_const*&,std::function<void(void_const*)>&> *)&data,&local_c8);
    std::pair<const_dap::TypeInfo_*,_std::function<void_(const_void_*)>_>::~pair(&local_c8);
    if (handler._M_invoker == (_Invoker_type)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      EventHandlers::error(&this->handlers,"No event handler registered for event \'%s\'",uVar2);
      std::function<void_()>::function(__return_storage_ptr__);
    }
    else {
      uVar3 = (**(code **)(*(long *)handler._M_invoker + 0x18))();
      puStack_e0 = (uint8_t *)operator_new__(uVar3);
      (**(code **)(*(long *)handler._M_invoker + 0x28))(handler._M_invoker,puStack_e0);
      uVar2 = event.field_2._8_8_;
      local_e1 = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_108,"body",&local_109);
      local_148.typeinfo = (TypeInfo **)&handler._M_invoker;
      local_148.data = &stack0xffffffffffffff20;
      local_148.body_ok = &local_e1;
      std::function<bool(dap::Deserializer*)>::
      function<(anonymous_namespace)::Impl::processEvent(dap::json::JsonCppDeserializer*)::_lambda(dap::Deserializer*)_1_,void>
                ((function<bool(dap::Deserializer*)> *)&local_130,&local_148);
      (**(code **)(*(long *)uVar2 + 0x50))(uVar2,local_108,&local_130);
      std::function<bool_(dap::Deserializer_*)>::~function(&local_130);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
      if ((local_e1 & 1U) == 0) {
        uVar2 = std::__cxx11::string::c_str();
        EventHandlers::error(&this->handlers,"Failed to deserialize event \'%s\' body",uVar2);
        (**(code **)(*(long *)handler._M_invoker + 0x38))(handler._M_invoker,puStack_e0);
        if (puStack_e0 != (uint8_t *)0x0) {
          operator_delete__(puStack_e0);
        }
        std::function<void_()>::function(__return_storage_ptr__);
      }
      else {
        std::function<void_(const_void_*)>::function
                  (&local_178.handler,(function<void_(const_void_*)> *)local_a0);
        local_178.data = puStack_e0;
        local_178.typeinfo = (TypeInfo *)handler._M_invoker;
        std::function<void()>::
        function<(anonymous_namespace)::Impl::processEvent(dap::json::JsonCppDeserializer*)::_lambda()_1_,void>
                  ((function<void()> *)__return_storage_ptr__,&local_178);
        (anonymous_namespace)::Impl::processEvent(dap::json::JsonCppDeserializer*)::{lambda()#1}::
        ~JsonCppDeserializer((_lambda___1_ *)&local_178);
      }
    }
    std::function<void_(const_void_*)>::~function((function<void_(const_void_*)> *)local_a0);
  }
  else {
    EventHandlers::error(&this->handlers,"Event missing string \'event\' field");
    std::function<void_()>::function(__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Payload processEvent(dap::json::Deserializer* d) {
    dap::string event;
    if (!d->field("event", &event)) {
      handlers.error("Event missing string 'event' field");
      return {};
    }

    const dap::TypeInfo* typeinfo;
    GenericEventHandler handler;
    std::tie(typeinfo, handler) = handlers.event(event);
    if (!typeinfo) {
      handlers.error("No event handler registered for event '%s'",
                     event.c_str());
      return {};
    }

    auto data = new uint8_t[typeinfo->size()];
    typeinfo->construct(data);

    // "body" is an optional field for some events, such as "Terminated Event".
    bool body_ok = true;
    d->field("body", [&](dap::Deserializer* d) {
      if (!typeinfo->deserialize(d, data)) {
        body_ok = false;
      }
      return true;
    });

    if (!body_ok) {
      handlers.error("Failed to deserialize event '%s' body", event.c_str());
      typeinfo->destruct(data);
      delete[] data;
      return {};
    }

    return [=] {
      handler(data);
      typeinfo->destruct(data);
      delete[] data;
    };
  }